

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
::~table_core(table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
              *this)

{
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
  *in_RDI;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
  *this_00;
  
  this_00 = in_RDI;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>::~for_all_elements()::_lambda(std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>*)_1_>
            (in_RDI,(anon_class_8_1_8991fb9c)in_RDI);
  delete_arrays(this_00,&in_RDI->arrays);
  empty_::
  empty_value<std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>,_2U,_true>
  ::~empty_value((empty_value<std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>,_2U,_true>
                  *)0x622d68);
  return;
}

Assistant:

~table_core() noexcept {
        for_all_elements([this](element_type* p) { destroy_element(p); });
        delete_arrays(arrays);
    }